

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O2

void __thiscall
DefaultIndexFixture_UpsertSingle_Test::~DefaultIndexFixture_UpsertSingle_Test
          (DefaultIndexFixture_UpsertSingle_Test *this)

{
  anon_unknown.dwarf_13be9a::DefaultIndexFixture::~DefaultIndexFixture
            (&this->super_DefaultIndexFixture);
  operator_delete(this,0x160);
  return;
}

Assistant:

TEST_F (DefaultIndexFixture, UpsertSingle) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    auto const first = std::make_pair ("a"s, "b"s);
    auto const second = std::make_pair ("a"s, "c"s);
    std::pair<default_index::iterator, bool> itp = index_->insert_or_assign (t1, first);
    std::string const & key = (*itp.first).first;
    EXPECT_EQ ("a", key);
    EXPECT_TRUE (itp.second);
    itp = index_->insert_or_assign (t1, second);
    std::string & value = (*itp.first).second;
    EXPECT_EQ ("c", value);
    EXPECT_FALSE (itp.second);
}